

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O3

void duckdb::ZSTDStorage::Compress(CompressionState *state_p,Vector *input,idx_t count)

{
  idx_t iVar1;
  idx_t iVar2;
  UnifiedVectorFormat vdata;
  anon_union_16_2_67f50693_for_value local_88;
  UnifiedVectorFormat local_70;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
  Vector::ToUnifiedFormat(input,count,&local_70);
  if (count != 0) {
    iVar2 = 0;
    do {
      iVar1 = iVar2;
      if ((local_70.sel)->sel_vector != (sel_t *)0x0) {
        iVar1 = (idx_t)(local_70.sel)->sel_vector[iVar2];
      }
      if (((local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar1 >> 6]
            >> (iVar1 & 0x3f) & 1) != 0)) && (*(int *)(local_70.data + iVar1 * 0x10) != 0)) {
        ZSTDCompressionState::AddString
                  ((ZSTDCompressionState *)state_p,(string_t *)(local_70.data + iVar1 * 0x10));
      }
      else {
        local_88._0_8_ = 0;
        local_88.pointer.ptr = (char *)0x0;
        ZSTDCompressionState::AddString
                  ((ZSTDCompressionState *)state_p,(string_t *)&local_88.pointer);
      }
      iVar2 = iVar2 + 1;
    } while (count != iVar2);
  }
  if (local_70.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ZSTDStorage::Compress(CompressionState &state_p, Vector &input, idx_t count) {
	auto &state = state_p.Cast<ZSTDCompressionState>();

	// Get vector data
	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);
	auto data = UnifiedVectorFormat::GetData<string_t>(vdata);

	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		// Note: we treat nulls and empty strings the same
		if (!vdata.validity.RowIsValid(idx) || data[idx].GetSize() == 0) {
			state.AddNull();
			continue;
		}
		state.AddString(data[idx]);
	}
}